

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

UBool __thiscall icu_63::NFRule::allIgnorable(NFRule *this,UnicodeString *str,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  RuleBasedCollator *pRVar4;
  CollationElementIterator *this_00;
  UBool UVar5;
  bool bVar6;
  LocalPointer<icu_63::CollationElementIterator> iter;
  UErrorCode err;
  undefined4 local_1c;
  undefined4 extraout_var;
  
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (iVar2 == 0) {
    UVar5 = '\x01';
  }
  else {
    iVar2 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar2 != '\0') {
      pRVar4 = RuleBasedNumberFormat::getCollator(this->formatter);
      if (pRVar4 != (RuleBasedCollator *)0x0) {
        iVar2 = (*(pRVar4->super_Collator).super_UObject._vptr_UObject[0x27])(pRVar4);
        this_00 = (CollationElementIterator *)CONCAT44(extraout_var,iVar2);
        if (this_00 == (CollationElementIterator *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          bVar6 = false;
        }
        else {
          str = (UnicodeString *)&stack0xffffffffffffffe4;
          local_1c = 0;
          uVar3 = CollationElementIterator::next(this_00,(UErrorCode *)str);
          while (uVar3 < 0x10000) {
            str = (UnicodeString *)&stack0xffffffffffffffe4;
            uVar3 = CollationElementIterator::next(this_00,(UErrorCode *)&stack0xffffffffffffffe4);
          }
          bVar6 = uVar3 == 0xffffffff;
        }
        if (this_00 == (CollationElementIterator *)0x0) {
          return bVar6;
        }
        CollationElementIterator::~CollationElementIterator(this_00);
        UMemory::operator_delete((UMemory *)this_00,str);
        return bVar6;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

UBool
NFRule::allIgnorable(const UnicodeString& str, UErrorCode& status) const
{
    // if the string is empty, we can just return true
    if (str.length() == 0) {
        return TRUE;
    }

#if !UCONFIG_NO_COLLATION
    // if lenient parsing is turned on, walk through the string with
    // a collation element iterator and make sure each collation
    // element is 0 (ignorable) at the primary level
    if (formatter->isLenient()) {
        const RuleBasedCollator* collator = formatter->getCollator();
        if (collator == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        LocalPointer<CollationElementIterator> iter(collator->createCollationElementIterator(str));

        // Memory allocation error check.
        if (iter.isNull()) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }

        UErrorCode err = U_ZERO_ERROR;
        int32_t o = iter->next(err);
        while (o != CollationElementIterator::NULLORDER
            && CollationElementIterator::primaryOrder(o) == 0) {
            o = iter->next(err);
        }

        return o == CollationElementIterator::NULLORDER;
    }
#endif

    // if lenient parsing is turned off, there is no such thing as
    // an ignorable character: return true only if the string is empty
    return FALSE;
}